

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlParser.cpp
# Opt level: O1

XMLError __thiscall
XMLParser::XMLNode::writeToFile(XMLNode *this,char *filename,char *encoding,char nFormat)

{
  XMLNodeData *pXVar1;
  bool bVar2;
  int iVar3;
  FILE *__s;
  size_t sVar4;
  char *pcVar5;
  XMLNode *A;
  bool bVar6;
  int i;
  int local_34;
  XMLNode local_30;
  
  if (this->d == (XMLNodeData *)0x0) {
    return eXMLErrorNone;
  }
  __s = fopen(filename,"wb");
  if (__s == (FILE *)0x0) {
    return eXMLErrorCannotOpenWriteFile;
  }
  pXVar1 = this->d;
  if ((pXVar1 == (XMLNodeData *)0x0) || (pXVar1->isDeclaration == '\0')) {
    if (pXVar1->lpszName == (char *)0x0) {
      if (pXVar1->nChild < 1) {
        A = (XMLNode *)&emptyXMLNode;
      }
      else {
        A = pXVar1->pChild;
      }
      XMLNode(&local_30,A);
      bVar2 = true;
      if (local_30.d == (XMLNodeData *)0x0) {
        bVar6 = true;
      }
      else {
        bVar6 = (local_30.d)->isDeclaration == '\0';
      }
    }
    else {
      bVar6 = true;
      bVar2 = false;
    }
  }
  else {
    bVar2 = false;
    bVar6 = false;
  }
  if (bVar2) {
    ~XMLNode(&local_30);
  }
  if (bVar6) {
    if (characterEncoding == 3) {
      encoding = "SHIFT-JIS";
    }
    else if (characterEncoding == 1) {
      local_34 = CONCAT13(local_34._3_1_,0xbf0000);
      local_34 = CONCAT22(local_34._2_2_,0xbbef);
      sVar4 = fwrite(&local_34,3,1,__s);
      if (sVar4 == 0) {
        fclose(__s);
        return eXMLErrorCannotWriteFile;
      }
      encoding = "utf-8";
    }
    pcVar5 = "ISO-8859-1";
    if (encoding != (char *)0x0) {
      pcVar5 = encoding;
    }
    iVar3 = fprintf(__s,"<?xml version=\"1.0\" encoding=\"%s\"?>\n",pcVar5);
    if (iVar3 < 0) goto LAB_00198470;
  }
  else if (characterEncoding == 1) {
    local_34 = CONCAT13(local_34._3_1_,0xbf0000);
    local_34 = CONCAT22(local_34._2_2_,0xbbef);
    sVar4 = fwrite(&local_34,3,1,__s);
    if (sVar4 == 0) goto LAB_00198470;
  }
  pcVar5 = createXMLString(this,(int)nFormat,&local_34);
  sVar4 = fwrite(pcVar5,(long)local_34,1,__s);
  if (sVar4 != 0) {
    iVar3 = fclose(__s);
    free(pcVar5);
    return (uint)(iVar3 != 0) << 4;
  }
  free(pcVar5);
LAB_00198470:
  fclose(__s);
  return eXMLErrorCannotWriteFile;
}

Assistant:

XMLError XMLNode::writeToFile(XMLCSTR filename, const char * encoding, char nFormat) const
    {
        if(!d)
            return eXMLErrorNone;
        FILE * f = xfopen(filename, _CXML("wb"));
        if(!f)
            return eXMLErrorCannotOpenWriteFile;
#ifdef _XMLWIDECHAR
        unsigned char h[2] = {0xFF, 0xFE};
        if(!fwrite(h, 2, 1, f))
        {
            fclose(f);
            return eXMLErrorCannotWriteFile;
        }
        if((!isDeclaration()) && ((d->lpszName) || (!getChildNode().isDeclaration())))
        {
            if(!fwrite(
                 L"<?xml version=\"1.0\" encoding=\"utf-16\"?>\n", sizeof(wchar_t) * 40, 1, f))
            {
                fclose(f);
                return eXMLErrorCannotWriteFile;
            }
        }
#else
        if((!isDeclaration()) && ((d->lpszName) || (!getChildNode().isDeclaration())))
        {
            if(characterEncoding == char_encoding_UTF8)
            {
                // header so that windows recognize the file as UTF-8:
                unsigned char h[3] = {0xEF, 0xBB, 0xBF};
                if(!fwrite(h, 3, 1, f))
                {
                    fclose(f);
                    return eXMLErrorCannotWriteFile;
                }
                encoding = "utf-8";
            }
            else if(characterEncoding == char_encoding_ShiftJIS)
                encoding = "SHIFT-JIS";

            if(!encoding)
                encoding = "ISO-8859-1";
            if(fprintf(f, "<?xml version=\"1.0\" encoding=\"%s\"?>\n", encoding) < 0)
            {
                fclose(f);
                return eXMLErrorCannotWriteFile;
            }
        }
        else
        {
            if(characterEncoding == char_encoding_UTF8)
            {
                unsigned char h[3] = {0xEF, 0xBB, 0xBF};
                if(!fwrite(h, 3, 1, f))
                {
                    fclose(f);
                    return eXMLErrorCannotWriteFile;
                }
            }
        }
#endif
        int i;
        XMLSTR t = createXMLString(nFormat, &i);
        if(!fwrite(t, sizeof(XMLCHAR) * i, 1, f))
        {
            free(t);
            fclose(f);
            return eXMLErrorCannotWriteFile;
        }
        if(fclose(f) != 0)
        {
            free(t);
            return eXMLErrorCannotWriteFile;
        }
        free(t);
        return eXMLErrorNone;
    }